

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::cmGlobalGenerator(cmGlobalGenerator *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_cmGlobalGenerator = (_func_int **)&PTR__cmGlobalGenerator_00960330;
  (this->MakeSilentFlag)._M_dataplus._M_p = (pointer)&(this->MakeSilentFlag).field_2;
  (this->MakeSilentFlag)._M_string_length = 0;
  (this->MakeSilentFlag).field_2._M_local_buf[0] = '\0';
  (this->FindMakeProgramFile)._M_dataplus._M_p = (pointer)&(this->FindMakeProgramFile).field_2;
  (this->FindMakeProgramFile)._M_string_length = 0;
  (this->FindMakeProgramFile).field_2._M_local_buf[0] = '\0';
  (this->ConfiguredFilesPath)._M_dataplus._M_p = (pointer)&(this->ConfiguredFilesPath).field_2;
  (this->ConfiguredFilesPath)._M_string_length = 0;
  (this->ConfiguredFilesPath).field_2._M_local_buf[0] = '\0';
  this->CMakeInstance = cm;
  p_Var1 = &(this->ProjectMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Makefiles).
  super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Makefiles).
  super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Makefiles).
  super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->LocalGenerators).
  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->LocalGenerators).
  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->LocalGenerators).
  super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->InstallComponents)._M_t._M_impl.super__Rb_tree_header;
  (this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->InstallComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExportSets).
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  (this->ExportSets).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExportSets).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExportSets).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExportSets).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExportSets).
  super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header;
  (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->BuildExportSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header;
  (this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->BuildExportExportSets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AliasTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetSearchIndex)._M_h._M_buckets = &(this->TargetSearchIndex)._M_h._M_single_bucket;
  (this->TargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->TargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->TargetSearchIndex)._M_h._M_element_count = 0;
  (this->TargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->TargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->TargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_buckets =
       &(this->GeneratorTargetSearchIndex)._M_h._M_single_bucket;
  (this->GeneratorTargetSearchIndex)._M_h._M_bucket_count = 1;
  (this->GeneratorTargetSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratorTargetSearchIndex)._M_h._M_element_count = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->GeneratorTargetSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratorTargetSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->MakefileSearchIndex)._M_h._M_buckets = &(this->MakefileSearchIndex)._M_h._M_single_bucket;
  (this->MakefileSearchIndex)._M_h._M_bucket_count = 1;
  (this->MakefileSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->MakefileSearchIndex)._M_h._M_element_count = 0;
  (this->MakefileSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->MakefileSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->MakefileSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->LocalGeneratorSearchIndex)._M_h._M_buckets =
       &(this->LocalGeneratorSearchIndex)._M_h._M_single_bucket;
  (this->LocalGeneratorSearchIndex)._M_h._M_bucket_count = 1;
  (this->LocalGeneratorSearchIndex)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->LocalGeneratorSearchIndex)._M_h._M_element_count = 0;
  (this->LocalGeneratorSearchIndex)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->LocalGeneratorSearchIndex)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->LocalGeneratorSearchIndex)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TargetOrderIndex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header;
  (this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->IgnoreExtensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->LanguagesReady)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguagesInProgress)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header;
  (this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->OutputExtensions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageToOutputExtension)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header;
  (this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->ExtensionToLanguage)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->LanguageToLinkerPreference)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header;
  (this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->RuleHashes)._M_t._M_impl.super__Rb_tree_header;
  (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->LanguageToOriginalSharedLibFlags)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->NextDeferId = 0;
  (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header;
  (this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->RuleHashes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ExtraGenerator)._M_t.
  super___uniq_ptr_impl<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExternalMakefileProjectGenerator_*,_std::default_delete<cmExternalMakefileProjectGenerator>_>
  .super__Head_base<0UL,_cmExternalMakefileProjectGenerator_*,_false>._M_head_impl =
       (cmExternalMakefileProjectGenerator *)0x0;
  (this->FilesReplacedDuringGenerate).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FilesReplacedDuringGenerate).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FilesReplacedDuringGenerate).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->TargetDependencies)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DirectoryContentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header;
  (this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->BinaryDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0042WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CMP0068WarnTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->FilenameTargetDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->RealPaths)._M_t._M_impl.super__Rb_tree_header;
  (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->RealPaths)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->GeneratedFiles)._M_h._M_buckets = &(this->GeneratedFiles)._M_h._M_single_bucket;
  (this->GeneratedFiles)._M_h._M_bucket_count = 1;
  (this->GeneratedFiles)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->GeneratedFiles)._M_h._M_element_count = 0;
  (this->GeneratedFiles)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  p_Var1 = &(this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header;
  (this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  (this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->RuntimeDependencySets).
  super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RuntimeDependencySets).
  super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RuntimeDependencySets).
  super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet,_std::default_delete<cmInstallRuntimeDependencySet>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->GeneratedFiles)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->GeneratedFiles)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->RuntimeDependencySetsByName)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cmFileLockPool::cmFileLockPool(&this->FileLockPool);
  (this->TryCompileTimeout).__r = 0.0;
  this->CurrentConfigureMakefile = (cmMakefile *)0x0;
  this->TryCompileOuterMakefile = (cmMakefile *)0x0;
  this->RecursionDepth = 0;
  this->FirstTimeProgress = 0.0;
  this->NeedSymbolicMark = false;
  this->UseLinkScript = false;
  this->ForceUnixPaths = false;
  this->ToolSupportsColor = false;
  this->InstallTargetEnabled = false;
  this->ConfigureDoneCMP0026AndCMP0024 = false;
  cmState::SetIsGeneratorMultiConfig
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetMinGWMake
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetMSYSShell
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetNMake((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                    _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetWatcomWMake
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetWindowsShell
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  cmState::SetWindowsVSIDE
            ((cm->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,false);
  return;
}

Assistant:

cmGlobalGenerator::cmGlobalGenerator(cmake* cm)
  : CMakeInstance(cm)
{
  // By default the .SYMBOLIC dependency is not needed on symbolic rules.
  this->NeedSymbolicMark = false;

  // by default use the native paths
  this->ForceUnixPaths = false;

  // By default do not try to support color.
  this->ToolSupportsColor = false;

  // By default do not use link scripts.
  this->UseLinkScript = false;

  // Whether an install target is needed.
  this->InstallTargetEnabled = false;

  // how long to let try compiles run
  this->TryCompileTimeout = cmDuration::zero();

  this->CurrentConfigureMakefile = nullptr;
  this->TryCompileOuterMakefile = nullptr;

  this->ConfigureDoneCMP0026AndCMP0024 = false;
  this->FirstTimeProgress = 0.0f;

  this->RecursionDepth = 0;

  cm->GetState()->SetIsGeneratorMultiConfig(false);
  cm->GetState()->SetMinGWMake(false);
  cm->GetState()->SetMSYSShell(false);
  cm->GetState()->SetNMake(false);
  cm->GetState()->SetWatcomWMake(false);
  cm->GetState()->SetWindowsShell(false);
  cm->GetState()->SetWindowsVSIDE(false);
}